

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::get_next_event(Drive *this,float duration_already_passed)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  float *pfVar4;
  float fVar5;
  float local_3c;
  float safe_gain_period;
  float local_34;
  undefined8 uStack_30;
  float interval;
  undefined1 local_20 [8];
  Event track_event;
  float duration_already_passed_local;
  Drive *this_local;
  
  track_event.length.length = (uint)duration_already_passed;
  unique0x1000025b = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->disk_);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->track_);
    if (bVar1) {
      if (0.0 < this->random_interval_) {
        *(undefined4 *)&(this->super_TimedEventLoop).field_0x1c = 1;
        *(float *)&this->field_0x30 = (float)((uint)this->random_source_ & 1 | 2) / 1e+06;
        this->random_source_ = this->random_source_ >> 1 | this->random_source_ << 0x3f;
        if (*(float *)&this->field_0x30 <= this->random_interval_ - 5e-06) {
          this->random_interval_ = this->random_interval_ - *(float *)&this->field_0x30;
          TimedEventLoop::set_next_event_time_interval
                    (&this->super_TimedEventLoop,*(float *)&this->field_0x30);
          return;
        }
        this->random_interval_ = 0.0;
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->track_);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->track_);
        iVar2 = (*peVar3->_vptr_Track[2])();
        uStack_30 = CONCAT44(extraout_var,iVar2);
        *(int *)&(this->super_TimedEventLoop).field_0x1c = iVar2;
        local_20 = (undefined1  [8])uStack_30;
        fVar5 = Time::get<float>((Time *)(local_20 + 4));
        *(float *)&this->field_0x30 = fVar5;
      }
      else {
        *(undefined4 *)&this->field_0x30 = 0x3f800000;
        *(undefined4 *)&(this->super_TimedEventLoop).field_0x1c = 0;
      }
      safe_gain_period =
           (*(float *)&this->field_0x30 - (float)track_event.length.length) *
           this->rotational_multiplier_;
      local_3c = 0.0;
      pfVar4 = std::max<float>(&safe_gain_period,&local_3c);
      local_34 = *pfVar4;
      if (1.5e-05 <= local_34) {
        this->random_interval_ = local_34 - 1.5e-05;
        local_34 = 1.5e-05;
      }
      TimedEventLoop::set_next_event_time_interval(&this->super_TimedEventLoop,local_34);
    }
    else {
      this->random_interval_ = 0.0;
      setup_track(this);
    }
  }
  else {
    *(undefined4 *)&(this->super_TimedEventLoop).field_0x1c = 0;
    *(undefined4 *)&this->field_0x30 = 0x3f800000;
    TimedEventLoop::set_next_event_time_interval
              (&this->super_TimedEventLoop,
               (*(float *)&this->field_0x30 - (float)track_event.length.length) *
               this->rotational_multiplier_);
  }
  return;
}

Assistant:

void Drive::get_next_event(float duration_already_passed) {
	/*
		Quick word on random-bit generation logic below; it seeks to obey the following logic:
		if there is a gap of 15µs between recorded bits, start generating flux transitions
		at random intervals thereafter, unless and until one is within 5µs of the next real transition.

		This behaviour is based on John Morris' observations of an MC3470, as described in his WOZ
		file format documentation — https://applesaucefdc.com/woz/reference2/
	*/

	if(!disk_) {
		current_event_.type = Track::Event::IndexHole;
		current_event_.length = 1.0f;
		set_next_event_time_interval((current_event_.length - duration_already_passed) * rotational_multiplier_);
		return;
	}

	// Grab a new track if not already in possession of one. This will recursively call get_next_event,
	// supplying a proper duration_already_passed.
	if(!track_) {
		random_interval_ = 0.0f;
		setup_track();
		return;
	}

	// If gain has now been turned up so as to generate noise, generate some noise.
	if(random_interval_ > 0.0f) {
		current_event_.type = Track::Event::FluxTransition;
		current_event_.length = float(2 + (random_source_&1)) / 1'000'000.0f;
		random_source_ = (random_source_ >> 1) | (random_source_ << 63);

		// If this random transition is closer than 5µs to the next real bit,
		// discard it.
		if(random_interval_ - 5.0f / 1'000'000.f < current_event_.length) {
			random_interval_ = 0.0f;
		} else {
			random_interval_ -= current_event_.length;
			set_next_event_time_interval(current_event_.length);
			return;
		}
	}

	if(track_) {
		const auto track_event = track_->get_next_event();
		current_event_.type = track_event.type;
		current_event_.length = track_event.length.get<float>();
	} else {
		current_event_.length = 1.0f;
		current_event_.type = Track::Event::IndexHole;
	}

	// divide interval, which is in terms of a single rotation of the disk, by rotation speed to
	// convert it into revolutions per second; this is achieved by multiplying by rotational_multiplier_
	float interval = std::max((current_event_.length - duration_already_passed) * rotational_multiplier_, 0.0f);

	// An interval greater than 15µs => adjust gain up the point where noise starts happening.
	// Seed that up and leave a 15µs gap until it starts.
	constexpr float safe_gain_period = 15.0f / 1'000'000.0f;
	if(interval >= safe_gain_period) {
		random_interval_ = interval - safe_gain_period;
		interval = safe_gain_period;
	}

	set_next_event_time_interval(interval);
}